

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::calendar_impl::set_option
          (calendar_impl *this,calendar_option_type opt,int param_3)

{
  undefined8 uVar1;
  date_time_error *this_00;
  int in_ESI;
  string *in_stack_ffffffffffffff68;
  date_time_error *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [48];
  
  if (in_ESI == 0) {
    local_45 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"is_gregorian is not settable options for calendar",&local_31);
    date_time_error::date_time_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_45 = 0;
    __cxa_throw(uVar1,&date_time_error::typeinfo,date_time_error::~date_time_error);
  }
  if (in_ESI != 1) {
    return;
  }
  this_00 = (date_time_error *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"is_dst is not settable options for calendar",&local_69);
  date_time_error::date_time_error(this_00,in_stack_ffffffffffffff68);
  __cxa_throw(this_00,&date_time_error::typeinfo,date_time_error::~date_time_error);
}

Assistant:

virtual void set_option(calendar_option_type opt,int /*v*/) 
        {
            switch(opt) {
            case is_gregorian:
                throw date_time_error("is_gregorian is not settable options for calendar");
            case is_dst:
                throw date_time_error("is_dst is not settable options for calendar");
            default:
                ;
            }
        }